

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_slice.c
# Opt level: O0

_Bool slice_fclose(ALLEGRO_FILE *f)

{
  byte bVar1;
  ALLEGRO_FILE *f_00;
  ALLEGRO_FILE *in_RDI;
  _Bool ret;
  void *unaff_retaddr;
  SLICE_DATA *slice;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  int line;
  
  f_00 = (ALLEGRO_FILE *)al_get_file_userdata(in_RDI);
  line = (int)((ulong)in_RDI >> 0x20);
  bVar1 = al_fseek(f_00,CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),0);
  al_free_with_context
            (unaff_retaddr,line,(char *)f_00,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
  return (_Bool)(bVar1 & 1);
}

Assistant:

static bool slice_fclose(ALLEGRO_FILE *f)
{
   SLICE_DATA *slice = al_get_file_userdata(f);
   bool ret;

   /* seek to end of slice */
   ret = al_fseek(slice->fp, slice->anchor + slice->size, ALLEGRO_SEEK_SET);

   al_free(slice);

   return ret;
}